

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

int Aig_ManCoCleanupBiere(Aig_Man_t *p)

{
  int iVar1;
  
  iVar1 = p->vCos->nSize;
  p->nObjs[3] = iVar1;
  if (p->nRegs != 0) {
    iVar1 = iVar1 - p->nRegs;
    p->nTruePos = iVar1;
  }
  return iVar1;
}

Assistant:

static inline int          Aig_ManCoNum( Aig_Man_t * p )          { return p->nObjs[AIG_OBJ_CO];                     }